

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractDOMParser.cpp
# Opt level: O0

void __thiscall xercesc_4_0::AbstractDOMParser::docComment(AbstractDOMParser *this,XMLCh *comment)

{
  int iVar1;
  undefined4 extraout_var;
  DOMParentNode *pDVar2;
  DOMComment *dcom;
  XMLCh *comment_local;
  AbstractDOMParser *this_local;
  
  if ((this->fCreateCommentNodes & 1U) != 0) {
    iVar1 = (*(this->fDocument->super_DOMMemoryManager)._vptr_DOMMemoryManager[0x34])
                      (this->fDocument,comment);
    pDVar2 = castToParentImpl(this->fCurrentParent);
    (**pDVar2->_vptr_DOMParentNode)(pDVar2,(DOMNode *)CONCAT44(extraout_var,iVar1));
    this->fCurrentNode = (DOMNode *)CONCAT44(extraout_var,iVar1);
  }
  return;
}

Assistant:

void AbstractDOMParser::docComment(const XMLCh* const comment)
{
    if (fCreateCommentNodes) {
        DOMComment *dcom = fDocument->createComment(comment);
        castToParentImpl (fCurrentParent)->appendChildFast (dcom);
        fCurrentNode = dcom;
    }
}